

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int fileext_n_compare(char *test_ext,char *known_ext,size_t maxlen)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char caps [8];
  char local_28 [8];
  
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  iVar1 = strncmp(test_ext,known_ext,4);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else if (known_ext != (char *)0x0 && test_ext != (char *)0x0) {
    sVar2 = strlen(known_ext);
    sVar3 = 4;
    if (sVar2 < 4) {
      sVar3 = sVar2;
    }
    if (sVar2 == 0) {
      sVar3 = 0;
    }
    else {
      sVar2 = 0;
      do {
        iVar1 = toupper((int)known_ext[sVar2]);
        local_28[sVar2] = (char)iVar1;
        sVar2 = sVar2 + 1;
      } while (sVar3 != sVar2);
    }
    local_28[sVar3] = '\0';
    iVar1 = strncmp(test_ext,local_28,4);
  }
  return iVar1;
}

Assistant:

static int fileext_n_compare(const char * test_ext,
                             const char * known_ext, size_t maxlen)
{
   char caps[8] = "";
   size_t c,len;
   /* if equal, don't need to check case (store to avoid multiple calls) */
   const int  cmp = strncmp(test_ext, known_ext, maxlen);
   if( cmp == 0 ) return cmp;

   /* if anything odd, use default */
   if( !test_ext || !known_ext ) return cmp;

   len = strlen(known_ext);
   if( len > maxlen ) len = maxlen;     /* ignore anything past maxlen */
   if( len > 7 ) return cmp;

   /* if here, strings are different but need to check upper-case */
   for(c = 0; c < len; c++ ) caps[c] = toupper((int) known_ext[c]);
   caps[c] = '\0';

   return strncmp(test_ext, caps, maxlen);
}